

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp-bare.c
# Opt level: O1

BinaryPacketProtocol * ssh2_bare_bpp_new(LogContext *logctx)

{
  void *__s;
  
  __s = safemalloc(1,0x118,0);
  memset(__s,0,0x118);
  *(BinaryPacketProtocolVtable **)((long)__s + 0x38) = &ssh2_bare_bpp_vtable;
  *(LogContext **)((long)__s + 0xd0) = logctx;
  ssh_bpp_common_setup((BinaryPacketProtocol *)((long)__s + 0x38));
  return (BinaryPacketProtocol *)((long)__s + 0x38);
}

Assistant:

BinaryPacketProtocol *ssh2_bare_bpp_new(LogContext *logctx)
{
    struct ssh2_bare_bpp_state *s = snew(struct ssh2_bare_bpp_state);
    memset(s, 0, sizeof(*s));
    s->bpp.vt = &ssh2_bare_bpp_vtable;
    s->bpp.logctx = logctx;
    ssh_bpp_common_setup(&s->bpp);
    return &s->bpp;
}